

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::Recover(DBImpl *this,VersionEdit *edit,bool *save_manifest)

{
  pointer *dbname;
  long *plVar1;
  unsigned_long *puVar2;
  iterator iVar3;
  DB DVar4;
  char cVar5;
  bool bVar6;
  ulong uVar7;
  VersionEdit *in_RCX;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> logs;
  FileType type;
  uint64_t number;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  SequenceNumber max_sequence;
  Status s;
  char buf [50];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> expected;
  Slice local_148;
  Slice local_138;
  unsigned_long *local_128;
  iterator iStack_120;
  unsigned_long *local_118;
  FileType local_104;
  ulong local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  ulong local_e0;
  DB local_d8;
  void *local_d0;
  string local_c8;
  undefined1 local_a8 [64];
  undefined1 local_68 [8];
  Logger *local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  size_t local_40;
  WritableFile *local_38;
  
  local_38 = *(WritableFile **)(in_FS_OFFSET + 0x28);
  plVar1 = (long *)(edit->comparator_)._M_string_length;
  dbname = &(edit->new_files_).
            super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (**(code **)(*plVar1 + 0x48))(&local_d0,plVar1,dbname);
  if (local_d0 != (void *)0x0) {
    operator_delete__(local_d0);
  }
  if (*(long *)((long)&edit[1].comparator_.field_2 + 8) != 0) {
    __assert_fail("db_lock_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x129,"Status leveldb::DBImpl::Recover(VersionEdit *, bool *)");
  }
  plVar1 = (long *)(edit->comparator_)._M_string_length;
  LockFileName((string *)local_a8,(string *)dbname);
  (**(code **)(*plVar1 + 0x68))
            (&local_d8,plVar1,(string *)local_a8,
             (undefined1 *)((long)&edit[1].comparator_.field_2 + 8));
  if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  if ((pointer)local_d8._vptr_DB == (pointer)0x0) {
    plVar1 = (long *)(edit->comparator_)._M_string_length;
    CurrentFileName((string *)local_a8,(string *)dbname);
    cVar5 = (**(code **)(*plVar1 + 0x30))(plVar1,local_a8);
    if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    if (cVar5 == '\0') {
      if ((char)edit->last_sequence_ != '\x01') {
        local_a8._0_8_ =
             (edit->new_files_).
             super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_a8._8_8_ =
             (edit->new_files_).
             super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_68 = (undefined1  [8])0x85b249;
        local_60 = (Logger *)0x2b;
        Status::Status((Status *)this,kInvalidArgument,(Slice *)local_a8,(Slice *)local_68);
        goto LAB_00647aa2;
      }
      NewDB((DBImpl *)local_a8);
      DVar4._vptr_DB = local_d8._vptr_DB;
      local_d8._vptr_DB = (_func_int **)local_a8._0_8_;
      local_a8._0_8_ = DVar4._vptr_DB;
      if ((pointer)DVar4._vptr_DB != (pointer)0x0) {
        operator_delete__(DVar4._vptr_DB);
      }
      if ((pointer)local_d8._vptr_DB != (pointer)0x0) goto LAB_00647a93;
    }
    else if (*(char *)((long)&edit->last_sequence_ + 1) == '\x01') {
      local_a8._0_8_ =
           (edit->new_files_).
           super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_a8._8_8_ =
           (edit->new_files_).
           super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68 = (undefined1  [8])0x85b275;
      local_60 = (Logger *)0x20;
      Status::Status((Status *)this,kInvalidArgument,(Slice *)local_a8,(Slice *)local_68);
      goto LAB_00647aa2;
    }
    VersionSet::Recover((VersionSet *)local_a8,(bool *)edit[3].next_file_number_);
    DVar4._vptr_DB = local_d8._vptr_DB;
    local_d8._vptr_DB = (_func_int **)local_a8._0_8_;
    local_a8._0_8_ = DVar4._vptr_DB;
    if ((pointer)DVar4._vptr_DB != (pointer)0x0) {
      operator_delete__(DVar4._vptr_DB);
    }
    if ((pointer)local_d8._vptr_DB == (pointer)0x0) {
      local_e0 = 0;
      uVar7 = *(ulong *)(edit[3].next_file_number_ + 0x60);
      uVar10 = *(ulong *)(edit[3].next_file_number_ + 0x68);
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      plVar1 = (long *)(edit->comparator_)._M_string_length;
      (**(code **)(*plVar1 + 0x38))(local_a8,plVar1,dbname);
      DVar4._vptr_DB = local_d8._vptr_DB;
      local_d8._vptr_DB = (_func_int **)local_a8._0_8_;
      local_a8._0_8_ = DVar4._vptr_DB;
      if ((pointer)DVar4._vptr_DB != (pointer)0x0) {
        operator_delete__(DVar4._vptr_DB);
      }
      if ((pointer)local_d8._vptr_DB == (pointer)0x0) {
        local_50 = (_Base_ptr)(local_68 + 8);
        local_60 = (Logger *)((ulong)local_60 & 0xffffffff00000000);
        local_58 = (_Base_ptr)0x0;
        local_40 = 0;
        local_48 = local_50;
        VersionSet::AddLiveFiles
                  ((VersionSet *)edit[3].next_file_number_,
                   (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   local_68);
        local_128 = (unsigned_long *)0x0;
        iStack_120._M_current = (unsigned_long *)0x0;
        local_118 = (unsigned_long *)0x0;
        if (local_f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar8 = 0;
          uVar9 = 0;
          do {
            bVar6 = ParseFileName((string *)
                                  ((long)&((local_f8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar8),&local_100,&local_104);
            if (bVar6) {
              pVar11 = std::
                       _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       ::equal_range((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                      *)local_68,&local_100);
              std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::_M_erase_aux((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                              *)local_68,(_Base_ptr)pVar11.first._M_node,
                             (_Base_ptr)pVar11.second._M_node);
              if ((local_104 == kLogFile) && ((uVar7 <= local_100 || (local_100 == uVar10)))) {
                if (iStack_120._M_current == local_118) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_128,
                             iStack_120,&local_100);
                }
                else {
                  *iStack_120._M_current = local_100;
                  iStack_120._M_current = iStack_120._M_current + 1;
                }
              }
            }
            uVar9 = uVar9 + 1;
            lVar8 = lVar8 + 0x20;
          } while (uVar9 < (ulong)((long)local_f8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_f8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        iVar3._M_current = iStack_120._M_current;
        puVar2 = local_128;
        if (local_40 == 0) {
          if (local_128 != iStack_120._M_current) {
            uVar7 = (long)iStack_120._M_current - (long)local_128 >> 3;
            lVar8 = 0x3f;
            if (uVar7 != 0) {
              for (; uVar7 >> lVar8 == 0; lVar8 = lVar8 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_128,iStack_120._M_current,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar2,iVar3._M_current);
          }
          if ((long)iStack_120._M_current - (long)local_128 != 0) {
            uVar7 = (long)iStack_120._M_current - (long)local_128 >> 3;
            uVar10 = 0;
            do {
              RecoverLogFile((DBImpl *)local_a8,(uint64_t)edit,SUB81(local_128[uVar10],0),
                             (bool *)(ulong)(uVar10 == uVar7 - 1),in_RCX,
                             (SequenceNumber *)save_manifest);
              DVar4._vptr_DB = local_d8._vptr_DB;
              local_d8._vptr_DB = (_func_int **)local_a8._0_8_;
              local_a8._0_8_ = DVar4._vptr_DB;
              if ((pointer)DVar4._vptr_DB != (pointer)0x0) {
                operator_delete__(DVar4._vptr_DB);
              }
              if ((pointer)local_d8._vptr_DB != (pointer)0x0) {
                (this->super_DB)._vptr_DB = local_d8._vptr_DB;
                local_d8._vptr_DB = (_func_int **)0x0;
                goto LAB_00647fd9;
              }
              VersionSet::MarkFileNumberUsed
                        ((VersionSet *)edit[3].next_file_number_,local_128[uVar10]);
              uVar10 = uVar10 + 1;
              uVar7 = (long)iStack_120._M_current - (long)local_128 >> 3;
            } while (uVar10 < uVar7);
          }
          if (*(ulong *)(edit[3].next_file_number_ + 0x58) < local_e0) {
            *(ulong *)(edit[3].next_file_number_ + 0x58) = local_e0;
          }
          (this->super_DB)._vptr_DB = (_func_int **)0x0;
        }
        else {
          snprintf(local_a8,0x32,"%d missing files; e.g.");
          local_138.data_ = local_a8;
          local_138.size_ = strlen(local_a8);
          TableFileName(&local_c8,(string *)dbname,*(uint64_t *)(local_50 + 1));
          local_148.data_ = local_c8._M_dataplus._M_p;
          local_148.size_ = local_c8._M_string_length;
          Status::Status((Status *)this,kCorruption,&local_138,&local_148);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
LAB_00647fd9:
        if (local_128 != (unsigned_long *)0x0) {
          operator_delete(local_128,(long)local_118 - (long)local_128);
        }
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)local_68);
      }
      else {
        (this->super_DB)._vptr_DB = local_d8._vptr_DB;
        local_d8._vptr_DB = (_func_int **)0x0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f8);
      goto LAB_00647aa2;
    }
  }
LAB_00647a93:
  (this->super_DB)._vptr_DB = local_d8._vptr_DB;
  local_d8._vptr_DB = (_func_int **)0x0;
LAB_00647aa2:
  if ((pointer)local_d8._vptr_DB != (pointer)0x0) {
    operator_delete__(local_d8._vptr_DB);
  }
  if (*(WritableFile **)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::Recover(VersionEdit* edit, bool* save_manifest) {
  mutex_.AssertHeld();

  // Ignore error from CreateDir since the creation of the DB is
  // committed only when the descriptor is created, and this directory
  // may already exist from a previous failed creation attempt.
  env_->CreateDir(dbname_);
  assert(db_lock_ == nullptr);
  Status s = env_->LockFile(LockFileName(dbname_), &db_lock_);
  if (!s.ok()) {
    return s;
  }

  if (!env_->FileExists(CurrentFileName(dbname_))) {
    if (options_.create_if_missing) {
      s = NewDB();
      if (!s.ok()) {
        return s;
      }
    } else {
      return Status::InvalidArgument(
          dbname_, "does not exist (create_if_missing is false)");
    }
  } else {
    if (options_.error_if_exists) {
      return Status::InvalidArgument(dbname_,
                                     "exists (error_if_exists is true)");
    }
  }

  s = versions_->Recover(save_manifest);
  if (!s.ok()) {
    return s;
  }
  SequenceNumber max_sequence(0);

  // Recover from all newer log files than the ones named in the
  // descriptor (new log files may have been added by the previous
  // incarnation without registering them in the descriptor).
  //
  // Note that PrevLogNumber() is no longer used, but we pay
  // attention to it in case we are recovering a database
  // produced by an older version of leveldb.
  const uint64_t min_log = versions_->LogNumber();
  const uint64_t prev_log = versions_->PrevLogNumber();
  std::vector<std::string> filenames;
  s = env_->GetChildren(dbname_, &filenames);
  if (!s.ok()) {
    return s;
  }
  std::set<uint64_t> expected;
  versions_->AddLiveFiles(&expected);
  uint64_t number;
  FileType type;
  std::vector<uint64_t> logs;
  for (size_t i = 0; i < filenames.size(); i++) {
    if (ParseFileName(filenames[i], &number, &type)) {
      expected.erase(number);
      if (type == kLogFile && ((number >= min_log) || (number == prev_log)))
        logs.push_back(number);
    }
  }
  if (!expected.empty()) {
    char buf[50];
    snprintf(buf, sizeof(buf), "%d missing files; e.g.",
             static_cast<int>(expected.size()));
    return Status::Corruption(buf, TableFileName(dbname_, *(expected.begin())));
  }

  // Recover in the order in which the logs were generated
  std::sort(logs.begin(), logs.end());
  for (size_t i = 0; i < logs.size(); i++) {
    s = RecoverLogFile(logs[i], (i == logs.size() - 1), save_manifest, edit,
                       &max_sequence);
    if (!s.ok()) {
      return s;
    }

    // The previous incarnation may not have written any MANIFEST
    // records after allocating this log number.  So we manually
    // update the file number allocation counter in VersionSet.
    versions_->MarkFileNumberUsed(logs[i]);
  }

  if (versions_->LastSequence() < max_sequence) {
    versions_->SetLastSequence(max_sequence);
  }

  return Status::OK();
}